

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O1

char * vkt::sr::anon_unknown_0::getIntUniformName(int number)

{
  switch(number) {
  case 0:
    return "ui_zero";
  case 1:
    return "ui_one";
  case 2:
    return "ui_two";
  case 3:
    return "ui_three";
  case 4:
    return "ui_four";
  case 5:
    return "ui_five";
  case 6:
    return "ui_six";
  case 7:
    return "ui_seven";
  case 8:
    return "ui_eight";
  }
  if (number != 0x65) {
    return "";
  }
  return "ui_oneHundredOne";
}

Assistant:

static const char* getIntUniformName (int number)
{
	switch (number)
	{
		case 0:		return "ui_zero";
		case 1:		return "ui_one";
		case 2:		return "ui_two";
		case 3:		return "ui_three";
		case 4:		return "ui_four";
		case 5:		return "ui_five";
		case 6:		return "ui_six";
		case 7:		return "ui_seven";
		case 8:		return "ui_eight";
		case 101:	return "ui_oneHundredOne";
		default:
			DE_ASSERT(false);
			return "";
	}
}